

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_fft_fftsg.c
# Opt level: O1

void cftf081(double *a,double *w)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  
  dVar1 = *a + a[8];
  dVar2 = a[1] + a[9];
  dVar6 = *a - a[8];
  dVar3 = a[1] - a[9];
  dVar9 = a[4] + a[0xc];
  dVar11 = a[5] + a[0xd];
  dVar8 = a[4] - a[0xc];
  dVar7 = a[5] - a[0xd];
  dVar5 = dVar1 + dVar9;
  dVar4 = dVar2 + dVar11;
  dVar1 = dVar1 - dVar9;
  dVar2 = dVar2 - dVar11;
  dVar13 = dVar6 - dVar7;
  dVar10 = dVar3 + dVar8;
  dVar7 = dVar7 + dVar6;
  dVar3 = dVar3 - dVar8;
  dVar9 = a[2] + a[10];
  dVar11 = a[3] + a[0xb];
  dVar17 = a[2] - a[10];
  dVar12 = a[3] - a[0xb];
  dVar8 = a[6] + a[0xe];
  dVar6 = a[6] - a[0xe];
  dVar16 = a[7] + a[0xf];
  dVar18 = a[7] - a[0xf];
  dVar14 = dVar9 + dVar8;
  dVar9 = dVar9 - dVar8;
  dVar15 = dVar11 + dVar16;
  dVar11 = dVar11 - dVar16;
  dVar8 = dVar17 - dVar18;
  dVar18 = dVar18 + dVar17;
  dVar17 = dVar12 + dVar6;
  dVar12 = dVar12 - dVar6;
  dVar6 = w[1];
  dVar16 = (dVar8 - dVar17) * dVar6;
  dVar17 = (dVar17 + dVar8) * dVar6;
  dVar8 = (dVar18 - dVar12) * dVar6;
  dVar6 = (dVar12 + dVar18) * dVar6;
  a[8] = dVar13 + dVar16;
  a[9] = dVar10 + dVar17;
  a[10] = dVar13 - dVar16;
  a[0xb] = dVar10 - dVar17;
  a[0xc] = dVar7 - dVar6;
  a[0xd] = dVar3 + dVar8;
  a[0xe] = dVar6 + dVar7;
  a[0xf] = dVar3 - dVar8;
  *a = dVar5 + dVar14;
  a[1] = dVar4 + dVar15;
  a[2] = dVar5 - dVar14;
  a[3] = dVar4 - dVar15;
  a[4] = dVar1 - dVar11;
  a[5] = dVar2 + dVar9;
  a[6] = dVar11 + dVar1;
  a[7] = dVar2 - dVar9;
  return;
}

Assistant:

void cftf081(FFTFLT *a, FFTFLT *w)
{
    FFTFLT wn4r, x0r, x0i, x1r, x1i, x2r, x2i, x3r, x3i,
        y0r, y0i, y1r, y1i, y2r, y2i, y3r, y3i,
        y4r, y4i, y5r, y5i, y6r, y6i, y7r, y7i;

    wn4r = w[1];
    x0r = a[0] + a[8];
    x0i = a[1] + a[9];
    x1r = a[0] - a[8];
    x1i = a[1] - a[9];
    x2r = a[4] + a[12];
    x2i = a[5] + a[13];
    x3r = a[4] - a[12];
    x3i = a[5] - a[13];
    y0r = x0r + x2r;
    y0i = x0i + x2i;
    y2r = x0r - x2r;
    y2i = x0i - x2i;
    y1r = x1r - x3i;
    y1i = x1i + x3r;
    y3r = x1r + x3i;
    y3i = x1i - x3r;
    x0r = a[2] + a[10];
    x0i = a[3] + a[11];
    x1r = a[2] - a[10];
    x1i = a[3] - a[11];
    x2r = a[6] + a[14];
    x2i = a[7] + a[15];
    x3r = a[6] - a[14];
    x3i = a[7] - a[15];
    y4r = x0r + x2r;
    y4i = x0i + x2i;
    y6r = x0r - x2r;
    y6i = x0i - x2i;
    x0r = x1r - x3i;
    x0i = x1i + x3r;
    x2r = x1r + x3i;
    x2i = x1i - x3r;
    y5r = wn4r * (x0r - x0i);
    y5i = wn4r * (x0r + x0i);
    y7r = wn4r * (x2r - x2i);
    y7i = wn4r * (x2r + x2i);
    a[8] = y1r + y5r;
    a[9] = y1i + y5i;
    a[10] = y1r - y5r;
    a[11] = y1i - y5i;
    a[12] = y3r - y7i;
    a[13] = y3i + y7r;
    a[14] = y3r + y7i;
    a[15] = y3i - y7r;
    a[0] = y0r + y4r;
    a[1] = y0i + y4i;
    a[2] = y0r - y4r;
    a[3] = y0i - y4i;
    a[4] = y2r - y6i;
    a[5] = y2i + y6r;
    a[6] = y2r + y6i;
    a[7] = y2i - y6r;
}